

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O1

int Res_WinMarkPaths_rec(Abc_Obj_t *pNode,Abc_Obj_t *pPivot,int nLevelMin)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  int Fill;
  int Fill_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  
  pAVar2 = pNode->pNtk;
  iVar5 = pNode->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar5 + 1,nLevelMin);
  if ((-1 < (long)iVar5) && (iVar5 < (pAVar2->vTravIds).nSize)) {
    pAVar3 = pNode->pNtk;
    uVar8 = 1;
    if ((pAVar2->vTravIds).pArray[iVar5] != pAVar3->nTravIds) {
      iVar5 = pNode->Id;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar5 + 1,Fill);
      if (((long)iVar5 < 0) || ((pAVar3->vTravIds).nSize <= iVar5)) goto LAB_0046906c;
      pAVar2 = pNode->pNtk;
      iVar7 = pAVar2->nTravIds + -1;
      uVar8 = 0;
      if ((pAVar3->vTravIds).pArray[iVar5] != iVar7) {
        iVar5 = pNode->Id;
        Vec_IntFillExtra(&pAVar2->vTravIds,iVar5 + 1,Fill_00);
        if (((long)iVar5 < 0) || ((pAVar2->vTravIds).nSize <= iVar5)) {
LAB_0046908b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pAVar2->vTravIds).pArray[iVar5] = iVar7;
        uVar8 = 0;
        if ((pNode != pPivot) && (nLevelMin < (int)(*(uint *)&pNode->field_0x14 >> 0xc))) {
          if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
            __assert_fail("Abc_ObjIsNode(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                          ,0x105,"int Res_WinMarkPaths_rec(Abc_Obj_t *, Abc_Obj_t *, int)");
          }
          if ((pNode->vFanins).nSize < 1) {
            uVar8 = 0;
            iVar5 = extraout_EDX;
          }
          else {
            lVar6 = 0;
            uVar8 = 0;
            do {
              uVar4 = Res_WinMarkPaths_rec
                                ((Abc_Obj_t *)
                                 pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar6]],pPivot,
                                 nLevelMin);
              uVar8 = uVar8 | uVar4;
              lVar6 = lVar6 + 1;
              iVar5 = extraout_EDX_00;
            } while (lVar6 < (pNode->vFanins).nSize);
          }
          if (uVar8 != 0) {
            pAVar2 = pNode->pNtk;
            iVar7 = pAVar2->nTravIds;
            iVar1 = pNode->Id;
            Vec_IntFillExtra(&pAVar2->vTravIds,iVar1 + 1,iVar5);
            if (((long)iVar1 < 0) || ((pAVar2->vTravIds).nSize <= iVar1)) goto LAB_0046908b;
            (pAVar2->vTravIds).pArray[iVar1] = iVar7;
          }
        }
      }
    }
    return uVar8;
  }
LAB_0046906c:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Res_WinMarkPaths_rec( Abc_Obj_t * pNode, Abc_Obj_t * pPivot, int nLevelMin )
{
    Abc_Obj_t * pFanin;
    int i, RetValue;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return 1;
    if ( Abc_NodeIsTravIdPrevious(pNode) )
        return 0;
    // assume that the node does not have access to the leaves
    Abc_NodeSetTravIdPrevious( pNode );
    // skip nodes below the given level
    if ( pNode == pPivot || (int)pNode->Level <= nLevelMin )
        return 0;
    assert( Abc_ObjIsNode(pNode) );
    // check if the fanins have access to the leaves
    RetValue = 0;
    Abc_ObjForEachFanin( pNode, pFanin, i )
        RetValue |= Res_WinMarkPaths_rec( pFanin, pPivot, nLevelMin );
    // relabel the node if it has access to the leaves
    if ( RetValue )
        Abc_NodeSetTravIdCurrent( pNode );
    return RetValue;
}